

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::incoming_connection_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,incoming_connection_alert *this)

{
  char *pcVar1;
  endpoint *in_RDX;
  char msg [600];
  string local_298;
  char local_278 [608];
  
  aux::print_endpoint_abi_cxx11_(&local_298,(aux *)&this->endpoint,in_RDX);
  pcVar1 = socket_type_name(this->socket_type);
  snprintf(local_278,600,"incoming connection from %s (%s)",local_298._M_dataplus._M_p,pcVar1);
  ::std::__cxx11::string::~string((string *)&local_298);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_278,(allocator<char> *)&local_298);
  return __return_storage_ptr__;
}

Assistant:

std::string incoming_connection_alert::message() const
	{
#ifdef TORRENT_DISABLE_ALERT_MSG
		return {};
#else
		char msg[600];
		std::snprintf(msg, sizeof(msg), "incoming connection from %s (%s)"
			, print_endpoint(endpoint).c_str(), socket_type_name(socket_type));
		return msg;
#endif
	}